

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

bool __thiscall
ctemplate::TemplateCache::TemplateIsCached(TemplateCache *this,TemplateCacheKey template_cache_key)

{
  Mutex *this_00;
  size_type sVar1;
  key_type local_30;
  
  local_30.first = template_cache_key.first;
  local_30.second = template_cache_key.second;
  this_00 = this->mutex_;
  Mutex::ReaderLock(this_00);
  sVar1 = std::
          _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&this->parsed_template_cache_->_M_h,&local_30);
  Mutex::ReaderUnlock(this_00);
  return sVar1 != 0;
}

Assistant:

bool TemplateCache::TemplateIsCached(const TemplateCacheKey template_cache_key)
    const {
  ReaderMutexLock ml(mutex_);
  return parsed_template_cache_->count(template_cache_key);
}